

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_strmatch_fuzzy_text(char *str,int str_len,char *pattern,int *out_score)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1343,"int nk_strmatch_fuzzy_text(const char *, int, const char *, int *)");
  }
  if (pattern == (char *)0x0) {
    __assert_fail("pattern",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1344,"int nk_strmatch_fuzzy_text(const char *, int, const char *, int *)");
  }
  iVar5 = 0;
  if (str_len != 0) {
    if (str_len < 1) {
      iVar10 = 0;
    }
    else {
      bVar20 = true;
      lVar13 = 0;
      iVar10 = 0;
      bVar3 = 0;
      bVar17 = false;
      pcVar14 = (char *)0x0;
      pcVar11 = pattern;
      uVar9 = 0;
      do {
        cVar1 = *pcVar11;
        iVar5 = (int)cVar1;
        bVar19 = false;
        cVar2 = *str;
        iVar15 = (int)cVar2;
        if (cVar1 == '\0') {
          bVar18 = false;
        }
        else {
          iVar12 = iVar5 + -0xa2;
          if (0x19 < iVar5 - 0x41U) {
            iVar12 = iVar5;
          }
          iVar8 = iVar15 + -0xa2;
          if (0x19 < iVar15 - 0x41U) {
            iVar8 = iVar15;
          }
          bVar18 = iVar12 == iVar8;
        }
        uVar6 = uVar9;
        if (pcVar14 == (char *)0x0) {
          pcVar14 = (char *)0x0;
LAB_0011b05a:
          uVar9 = 0;
        }
        else {
          iVar8 = (int)*pcVar14;
          iVar12 = iVar8 + -0x20;
          if (0x19 < iVar8 - 0x61U) {
            iVar12 = iVar8;
          }
          iVar16 = iVar15 + -0x20;
          if (0x19 < iVar15 - 0x61U) {
            iVar16 = iVar15;
          }
          bVar19 = iVar12 == iVar16;
          bVar4 = bVar18;
          if (cVar1 != '\0') {
            iVar12 = iVar8 + -0xa2;
            if (0x19 < iVar8 - 0x41U) {
              iVar12 = iVar8;
            }
            iVar8 = iVar5 + -0xa2;
            if (0x19 < iVar5 - 0x41U) {
              iVar8 = iVar5;
            }
            bVar4 = (bool)(iVar12 == iVar8 | bVar18);
          }
          if (bVar4 == false) goto LAB_0011b05a;
          pcVar14 = (char *)0x0;
          uVar6 = 0;
          if (bVar4 == false) goto LAB_0011b05a;
        }
        iVar10 = uVar9 + iVar10;
        if (bVar19 || bVar18 != false) {
          if (pcVar11 == pattern) {
            iVar5 = -9;
            if (-9 < (int)lVar13) {
              iVar5 = (int)lVar13;
            }
            iVar10 = iVar10 + iVar5;
          }
          uVar9 = (uint)bVar3 * 5 + 10;
          if (!bVar20) {
            uVar9 = (uint)bVar3 * 5;
          }
          uVar7 = uVar9 + 10;
          if (iVar15 - 0x5bU < 0xffffffe6) {
            uVar7 = uVar9;
          }
          if (!bVar17) {
            uVar7 = uVar9;
          }
          pcVar11 = pcVar11 + bVar18;
          bVar20 = pcVar14 != (char *)0x0;
          if (uVar6 <= uVar7) {
            pcVar14 = str;
          }
          uVar9 = uVar7;
          if (uVar7 <= uVar6) {
            uVar9 = uVar6;
          }
          iVar10 = iVar10 - (uint)(uVar6 <= uVar7 && bVar20);
          bVar3 = 1;
          uVar6 = uVar9;
        }
        else {
          iVar10 = iVar10 + -1;
          bVar3 = 0;
        }
        bVar17 = iVar15 - 0x61U < 0x1a;
        bVar20 = cVar2 == ' ' || cVar2 == '_';
        lVar13 = lVar13 + -3;
        str = str + 1;
        uVar9 = uVar6;
      } while ((ulong)(uint)str_len * 3 + lVar13 != 0);
      if (pcVar14 == (char *)0x0) {
        uVar6 = 0;
      }
      iVar10 = iVar10 + uVar6;
      pattern = pcVar11;
    }
    iVar5 = 0;
    if ((*pattern == '\0') && (iVar5 = 1, out_score != (int *)0x0)) {
      *out_score = iVar10;
    }
  }
  return iVar5;
}

Assistant:

NK_API int
nk_strmatch_fuzzy_text(const char *str, int str_len,
    const char *pattern, int *out_score)
{
    /* Returns true if each character in pattern is found sequentially within str
     * if found then out_score is also set. Score value has no intrinsic meaning.
     * Range varies with pattern. Can only compare scores with same search pattern. */

    /* ------- scores --------- */
    /* bonus for adjacent matches */
    #define NK_ADJACENCY_BONUS 5
    /* bonus if match occurs after a separator */
    #define NK_SEPARATOR_BONUS 10
    /* bonus if match is uppercase and prev is lower */
    #define NK_CAMEL_BONUS 10
    /* penalty applied for every letter in str before the first match */
    #define NK_LEADING_LETTER_PENALTY (-3)
    /* maximum penalty for leading letters */
    #define NK_MAX_LEADING_LETTER_PENALTY (-9)
    /* penalty for every letter that doesn't matter */
    #define NK_UNMATCHED_LETTER_PENALTY (-1)

    /* loop variables */
    int score = 0;
    char const * pattern_iter = pattern;
    int str_iter = 0;
    int prev_matched = nk_false;
    int prev_lower = nk_false;
    /* true so if first letter match gets separator bonus*/
    int prev_separator = nk_true;

    /* use "best" matched letter if multiple string letters match the pattern */
    char const * best_letter = 0;
    int best_letter_score = 0;

    /* loop over strings */
    NK_ASSERT(str);
    NK_ASSERT(pattern);
    if (!str || !str_len || !pattern) return 0;
    while (str_iter < str_len)
    {
        const char pattern_letter = *pattern_iter;
        const char str_letter = str[str_iter];

        int next_match = *pattern_iter != '\0' &&
            nk_to_lower(pattern_letter) == nk_to_lower(str_letter);
        int rematch = best_letter && nk_to_upper(*best_letter) == nk_to_upper(str_letter);

        int advanced = next_match && best_letter;
        int pattern_repeat = best_letter && *pattern_iter != '\0';
        pattern_repeat = pattern_repeat &&
            nk_to_lower(*best_letter) == nk_to_lower(pattern_letter);

        if (advanced || pattern_repeat) {
            score += best_letter_score;
            best_letter = 0;
            best_letter_score = 0;
        }

        if (next_match || rematch)
        {
            int new_score = 0;
            /* Apply penalty for each letter before the first pattern match */
            if (pattern_iter == pattern) {
                int count = (int)(&str[str_iter] - str);
                int penalty = NK_LEADING_LETTER_PENALTY * count;
                if (penalty < NK_MAX_LEADING_LETTER_PENALTY)
                    penalty = NK_MAX_LEADING_LETTER_PENALTY;

                score += penalty;
            }

            /* apply bonus for consecutive bonuses */
            if (prev_matched)
                new_score += NK_ADJACENCY_BONUS;

            /* apply bonus for matches after a separator */
            if (prev_separator)
                new_score += NK_SEPARATOR_BONUS;

            /* apply bonus across camel case boundaries */
            if (prev_lower && nk_is_upper(str_letter))
                new_score += NK_CAMEL_BONUS;

            /* update pattern iter IFF the next pattern letter was matched */
            if (next_match)
                ++pattern_iter;

            /* update best letter in str which may be for a "next" letter or a rematch */
            if (new_score >= best_letter_score) {
                /* apply penalty for now skipped letter */
                if (best_letter != 0)
                    score += NK_UNMATCHED_LETTER_PENALTY;

                best_letter = &str[str_iter];
                best_letter_score = new_score;
            }
            prev_matched = nk_true;
        } else {
            score += NK_UNMATCHED_LETTER_PENALTY;
            prev_matched = nk_false;
        }

        /* separators should be more easily defined */
        prev_lower = nk_is_lower(str_letter) != 0;
        prev_separator = str_letter == '_' || str_letter == ' ';

        ++str_iter;
    }

    /* apply score for last match */
    if (best_letter)
        score += best_letter_score;

    /* did not match full pattern */
    if (*pattern_iter != '\0')
        return nk_false;

    if (out_score)
        *out_score = score;
    return nk_true;
}